

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,string *shaderSource,
               ExpectResult expect)

{
  Shader *this;
  bool bVar1;
  RenderContext *renderCtx;
  MessageBuilder *this_00;
  MessageBuilder local_260;
  undefined1 local_d0 [8];
  string message;
  Shader shader;
  char *pcStack_40;
  int length;
  char *source;
  TestLog *pTStack_30;
  bool testFailed;
  TestLog *log;
  string *psStack_20;
  ExpectResult expect_local;
  string *shaderSource_local;
  NegativeTestContext *pNStack_10;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  log._4_4_ = expect;
  psStack_20 = shaderSource;
  shaderSource_local._4_4_ = shaderType;
  pNStack_10 = ctx;
  pTStack_30 = glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  source._7_1_ = 0;
  pcStack_40 = (char *)std::__cxx11::string::c_str();
  shader.m_info.compileTimeUs._4_4_ = std::__cxx11::string::size();
  renderCtx = NegativeTestContext::getRenderContext(pNStack_10);
  this = (Shader *)((long)&message.field_2 + 8);
  glu::Shader::Shader(this,renderCtx,shaderSource_local._4_4_);
  std::__cxx11::string::string((string *)local_d0);
  glu::Shader::setSources
            (this,1,&stack0xffffffffffffffc0,(int *)((long)&shader.m_info.compileTimeUs + 4));
  glu::Shader::compile((Shader *)((long)&message.field_2 + 8));
  glu::operator<<(pTStack_30,(Shader *)((long)&message.field_2 + 8));
  if (log._4_4_ == EXPECT_RESULT_PASS) {
    bVar1 = glu::Shader::getCompileStatus((Shader *)((long)&message.field_2 + 8));
    source._7_1_ = ~bVar1 & 1;
    std::__cxx11::string::operator=((string *)local_d0,"Shader did not compile.");
  }
  else {
    source._7_1_ = glu::Shader::getCompileStatus((Shader *)((long)&message.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_d0,"Shader was not expected to compile.");
  }
  if ((source._7_1_ & 1) != 0) {
    tcu::TestLog::operator<<(&local_260,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_260,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_260);
    NegativeTestContext::fail(pNStack_10,(string *)local_d0);
  }
  std::__cxx11::string::~string((string *)local_d0);
  glu::Shader::~Shader((Shader *)((long)&message.field_2 + 8));
  return;
}

Assistant:

void verifyShader(NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource, ExpectResult expect)
{
	DE_ASSERT(expect >= EXPECT_RESULT_PASS && expect < EXPECT_RESULT_LAST);

	tcu::TestLog&		log			= ctx.getLog();
	bool				testFailed	= false;
	const char* const	source		= shaderSource.c_str();
	const int			length		= (int) shaderSource.size();
	glu::Shader			shader		(ctx.getRenderContext(), shaderType);
	std::string			message;

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;

	if (expect == EXPECT_RESULT_PASS)
	{
		testFailed = !shader.getCompileStatus();
		message = "Shader did not compile.";
	}
	else
	{
		testFailed = shader.getCompileStatus();
		message = "Shader was not expected to compile.";
	}

	if (testFailed)
	{
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}